

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O0

UnicodeString * __thiscall
icu_63::RuleBasedNumberFormat::format
          (RuleBasedNumberFormat *this,int64_t number,NFRuleSet *ruleSet,UnicodeString *toAppendTo,
          UErrorCode *status)

{
  bool bVar1;
  UBool UVar2;
  int32_t startPos_00;
  int32_t pos_00;
  NumberFormat *pNVar3;
  DecimalQuantity *this_00;
  size_t size;
  DecimalQuantity *local_108;
  int32_t startPos;
  DecimalQuantity *decimalQuantity;
  undefined1 local_c8 [8];
  FieldPosition pos;
  Formattable f;
  NumberFormat *decimalFormat;
  UErrorCode *status_local;
  UnicodeString *toAppendTo_local;
  NFRuleSet *ruleSet_local;
  int64_t number_local;
  RuleBasedNumberFormat *this_local;
  
  UVar2 = ::U_SUCCESS(*status);
  if (UVar2 != '\0') {
    if (number == -0x8000000000000000) {
      pNVar3 = NumberFormat::createInstance(&this->locale,UNUM_DECIMAL,status);
      if (pNVar3 == (NumberFormat *)0x0) {
        return toAppendTo;
      }
      Formattable::Formattable((Formattable *)&pos.fEndIndex);
      size = 0xffffffff;
      FieldPosition::FieldPosition((FieldPosition *)local_c8,-1);
      this_00 = (DecimalQuantity *)UMemory::operator_new((UMemory *)0x50,size);
      local_108 = (DecimalQuantity *)0x0;
      if (this_00 != (DecimalQuantity *)0x0) {
        icu_63::number::impl::DecimalQuantity::DecimalQuantity(this_00);
        local_108 = this_00;
      }
      if (local_108 == (DecimalQuantity *)0x0) {
        *status = U_MEMORY_ALLOCATION_ERROR;
        if (pNVar3 != (NumberFormat *)0x0) {
          (*(pNVar3->super_Format).super_UObject._vptr_UObject[1])();
        }
        bVar1 = true;
        this_local = (RuleBasedNumberFormat *)toAppendTo;
      }
      else {
        icu_63::number::impl::DecimalQuantity::setToLong(local_108,-0x8000000000000000);
        Formattable::adoptDecimalQuantity((Formattable *)&pos.fEndIndex,local_108);
        (*(pNVar3->super_Format).super_UObject._vptr_UObject[5])
                  (pNVar3,&pos.fEndIndex,toAppendTo,local_c8,status);
        if (pNVar3 != (NumberFormat *)0x0) {
          (*(pNVar3->super_Format).super_UObject._vptr_UObject[1])();
        }
        bVar1 = false;
      }
      FieldPosition::~FieldPosition((FieldPosition *)local_c8);
      Formattable::~Formattable((Formattable *)&pos.fEndIndex);
      if (bVar1) {
        return (UnicodeString *)this_local;
      }
    }
    else {
      startPos_00 = UnicodeString::length(toAppendTo);
      pos_00 = UnicodeString::length(toAppendTo);
      NFRuleSet::format(ruleSet,number,toAppendTo,pos_00,0,status);
      adjustForCapitalizationContext(this,startPos_00,toAppendTo,status);
    }
  }
  return toAppendTo;
}

Assistant:

UnicodeString&
RuleBasedNumberFormat::format(int64_t number, NFRuleSet *ruleSet, UnicodeString& toAppendTo, UErrorCode& status) const
{
    // all API format() routines that take a double vector through
    // here.  We have these two identical functions-- one taking a
    // double and one taking a long-- the couple digits of precision
    // that long has but double doesn't (both types are 8 bytes long,
    // but double has to borrow some of the mantissa bits to hold
    // the exponent).
    // Create an empty string buffer where the result will
    // be built, and pass it to the rule set (along with an insertion
    // position of 0 and the number being formatted) to the rule set
    // for formatting

    if (U_SUCCESS(status)) {
        if (number == U_INT64_MIN) {
            // We can't handle this value right now. Provide an accurate default value.

            // TODO this section should probably be optimized. The DecimalFormat is shared in ICU4J.
            NumberFormat *decimalFormat = NumberFormat::createInstance(locale, UNUM_DECIMAL, status);
            if (decimalFormat == nullptr) {
                return toAppendTo;
            }
            Formattable f;
            FieldPosition pos(FieldPosition::DONT_CARE);
            DecimalQuantity *decimalQuantity = new DecimalQuantity();
            if (decimalQuantity == nullptr) {
                status = U_MEMORY_ALLOCATION_ERROR;
                delete decimalFormat;
                return toAppendTo;
            }
            decimalQuantity->setToLong(number);
            f.adoptDecimalQuantity(decimalQuantity); // f now owns decimalQuantity.
            decimalFormat->format(f, toAppendTo, pos, status);
            delete decimalFormat;
        }
        else {
            int32_t startPos = toAppendTo.length();
            ruleSet->format(number, toAppendTo, toAppendTo.length(), 0, status);
            adjustForCapitalizationContext(startPos, toAppendTo, status);
        }
    }
    return toAppendTo;
}